

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputIterator.hpp
# Opt level: O0

vector<supermap::Key<2UL>,_std::allocator<supermap::Key<2UL>_>_> * __thiscall
supermap::io::
InputIterator<supermap::StorageValueIgnorer<supermap::Key<2ul>,supermap::ByteArray<4ul>>,unsigned_int,6ul,void>
::collectWith<_DOCTEST_ANON_SUITE_2::_DOCTEST_ANON_FUNC_39()::__2,supermap::Key<2ul>>
          (void *param_1,long param_2,uint param_3)

{
  uint32_t uVar1;
  undefined1 auVar2 [16];
  pointer pIVar3;
  uint *puVar4;
  char *pcVar5;
  pointer pcVar6;
  uint objectI;
  stringstream iss;
  unique_ptr<char[],_std::default_delete<char[]>_> bytes;
  uint64_t bytesToRead;
  uint objectsToRead;
  size_t bytes_1;
  uint objectsInStream;
  vector<supermap::Key<2UL>,_std::allocator<supermap::Key<2UL>_>_> *collection;
  istream *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  array<unsigned_char,_2UL> in_stack_fffffffffffffdb4;
  array<unsigned_char,_2UL> in_stack_fffffffffffffdb6;
  vector<supermap::Key<2UL>,_std::allocator<supermap::Key<2UL>_>_> *this;
  size_t in_stack_fffffffffffffdc8;
  allocator *paVar7;
  vector<supermap::Key<2UL>,_std::allocator<supermap::Key<2UL>_>_> *this_00;
  array<unsigned_char,_2UL> local_204;
  array<unsigned_char,_2UL> local_202;
  uint local_200;
  allocator local_1f9;
  string local_1f8 [32];
  stringstream local_1d8 [400];
  vector<supermap::Key<2UL>,_std::allocator<supermap::Key<2UL>_>_> *local_48;
  uint local_40;
  ulong local_30;
  uint local_24;
  byte local_1d;
  uint local_1c;
  long local_18;
  anon_class_1_0_00000001 local_9;
  void *local_8;
  
  local_1d = 0;
  this_00 = (vector<supermap::Key<2UL>,_std::allocator<supermap::Key<2UL>_>_> *)param_1;
  local_1c = param_3;
  local_18 = param_2;
  local_8 = param_1;
  std::vector<supermap::Key<2UL>,_std::allocator<supermap::Key<2UL>_>_>::vector
            ((vector<supermap::Key<2UL>,_std::allocator<supermap::Key<2UL>_>_> *)0x139d85);
  pIVar3 = std::
           unique_ptr<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>::
           operator->((unique_ptr<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
                       *)0x139d8f);
  local_30 = (**(code **)(*(long *)pIVar3 + 8))();
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_30;
  local_40 = SUB164(auVar2 / ZEXT816(6),0);
  local_24 = local_40;
  if (local_1c != 0) {
    puVar4 = std::min<unsigned_int>(&local_24,&local_1c);
    local_40 = *puVar4;
  }
  std::vector<supermap::Key<2UL>,_std::allocator<supermap::Key<2UL>_>_>::reserve
            (this_00,(size_type)param_1);
  local_48 = (vector<supermap::Key<2UL>,_std::allocator<supermap::Key<2UL>_>_> *)
             ((ulong)local_40 * 6);
  std::make_unique<char[]>(in_stack_fffffffffffffdc8);
  pIVar3 = std::
           unique_ptr<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>::
           operator->((unique_ptr<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
                       *)0x139e65);
  pcVar5 = (char *)(*(code *)**(undefined8 **)pIVar3)();
  pcVar6 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                      CONCAT26(in_stack_fffffffffffffdb6._M_elems,
                               CONCAT24(in_stack_fffffffffffffdb4._M_elems,in_stack_fffffffffffffdb0
                                       )));
  std::istream::read(pcVar5,(long)pcVar6);
  pcVar6 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                      CONCAT26(in_stack_fffffffffffffdb6._M_elems,
                               CONCAT24(in_stack_fffffffffffffdb4._M_elems,in_stack_fffffffffffffdb0
                                       )));
  paVar7 = &local_1f9;
  this = local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,pcVar6,(ulong)this,paVar7);
  std::__cxx11::stringstream::stringstream(local_1d8,local_1f8,_S_in);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  for (local_200 = 0; local_200 < local_40; local_200 = local_200 + 1) {
    in_stack_fffffffffffffdb6._M_elems =
         (_Type)deserialize<supermap::StorageValueIgnorer<supermap::Key<2ul>,supermap::ByteArray<4ul>>,void>
                          (in_stack_fffffffffffffda8);
    uVar1 = *(uint32_t *)(param_2 + 8);
    *(uint32_t *)(param_2 + 8) = uVar1 + 1;
    local_204._M_elems = in_stack_fffffffffffffdb6._M_elems;
    in_stack_fffffffffffffdb4._M_elems =
         (_Type)_DOCTEST_ANON_SUITE_2::_DOCTEST_ANON_FUNC_39::anon_class_1_0_00000001::operator()
                          (&local_9,(StorageValueIgnorer<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>
                                     *)&local_204,uVar1);
    local_202._M_elems = in_stack_fffffffffffffdb4._M_elems;
    std::vector<supermap::Key<2UL>,_std::allocator<supermap::Key<2UL>_>_>::push_back
              ((vector<supermap::Key<2UL>,_std::allocator<supermap::Key<2UL>_>_> *)
               CONCAT26(in_stack_fffffffffffffdb6._M_elems,
                        CONCAT24(in_stack_fffffffffffffdb4._M_elems,in_stack_fffffffffffffdb0)),
               (value_type *)in_stack_fffffffffffffda8);
  }
  local_1d = 1;
  std::__cxx11::stringstream::~stringstream(local_1d8);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)
             CONCAT26(in_stack_fffffffffffffdb6._M_elems,
                      CONCAT24(in_stack_fffffffffffffdb4._M_elems,in_stack_fffffffffffffdb0)));
  if ((local_1d & 1) == 0) {
    std::vector<supermap::Key<2UL>,_std::allocator<supermap::Key<2UL>_>_>::~vector(this);
  }
  return this_00;
}

Assistant:

std::vector<Result> collectWith(Functor functor, IndexT collectionSizeLimit = 0) {
        std::vector<Result> collection;
        IndexT objectsInStream;
        {
            auto bytes = input_->availableBytes();
            assert(bytes % EachSize == 0);
            objectsInStream = bytes / EachSize;
        }
        IndexT objectsToRead;
        if (collectionSizeLimit == 0) {
            objectsToRead = objectsInStream;
        } else {
            objectsToRead = std::min(objectsInStream, collectionSizeLimit);
        }
        collection.reserve(objectsToRead);
        const std::uint64_t bytesToRead = static_cast<std::uint64_t>(objectsToRead) * EachSize;
        std::unique_ptr<char[]> bytes = std::make_unique<char[]>(bytesToRead);
        input_->get().read(bytes.get(), bytesToRead);
        std::stringstream iss(std::string(bytes.get(), bytesToRead), std::ios_base::in);
        for (IndexT objectI = 0; objectI < objectsToRead; ++objectI) {
            collection.push_back(functor(deserialize<T>(iss), index_++));
        }
        return collection;
    }